

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_rtd_32(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint addr_in;
  
  uVar1 = m68ki_cpu.dar[0xf];
  if (((ushort)m68ki_cpu.cpu_type & 0x3fc) != 0) {
    m68ki_cpu.dar[0xf] = m68ki_cpu.dar[0xf] + 4;
    my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar1 = pmmu_translate_addr(uVar1);
    }
    uVar2 = m68k_read_memory_32(uVar1 & m68ki_cpu.address_mask);
    uVar1 = m68ki_cpu.dar[0xf];
    my_fc_handler(m68ki_cpu.s_flag | 2);
    addr_in = m68ki_cpu.pc & m68ki_cpu.address_mask;
    m68ki_cpu.pc = m68ki_cpu.pc + 2;
    my_fc_handler(m68ki_cpu.s_flag | 2);
    if (m68ki_cpu.pmmu_enabled != 0) {
      addr_in = pmmu_translate_addr(addr_in);
    }
    uVar3 = m68k_read_memory_16(addr_in & m68ki_cpu.address_mask);
    m68ki_cpu.dar[0xf] = (int)(short)uVar3 + uVar1;
    m68ki_cpu.pc = uVar2;
    return;
  }
  m68ki_exception_illegal();
  return;
}

Assistant:

static void m68k_op_rtd_32(void)
{
	if(CPU_TYPE_IS_010_PLUS(CPU_TYPE))
	{
		uint new_pc = m68ki_pull_32();

		m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
		REG_A[7] = MASK_OUT_ABOVE_32(REG_A[7] + MAKE_INT_16(OPER_I_16()));
		m68ki_jump(new_pc);
		return;
	}
	m68ki_exception_illegal();
}